

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::AppendFromSelf
          (SnappyIOVecWriter *this,size_t offset,size_t len,char **param_4)

{
  long lVar1;
  char *op;
  unsigned_long *puVar2;
  ulong in_RDX;
  char *in_RSI;
  ulong *in_RDI;
  size_t to_copy_1;
  size_t to_copy;
  size_t from_iov_offset;
  iovec *from_iov;
  size_t space_left;
  ulong in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  SnappyIOVecWriter *in_stack_ffffffffffffffb8;
  iovec *iov;
  ulong local_20;
  char *local_18;
  bool local_1;
  
  if (in_RSI + -1 < (char *)in_RDI[4]) {
    if (in_RDI[5] - in_RDI[4] < in_RDX) {
      local_1 = false;
    }
    else {
      op = (char *)(*(long *)(in_RDI[1] + 8) - in_RDI[3]);
      iov = (iovec *)in_RDI[1];
      for (local_18 = in_RSI; local_20 = in_RDX, local_18 != (char *)0x0;
          local_18 = local_18 + lVar1) {
        if (local_18 <= op) {
          op = op + -(long)local_18;
          break;
        }
        lVar1 = -(long)op;
        op = (char *)iov[-1].iov_len;
        iov = iov + -1;
      }
      while (local_20 != 0) {
        if (iov == (iovec *)in_RDI[1]) {
          in_stack_ffffffffffffffa8 = in_RDI[3];
          if (in_stack_ffffffffffffffa8 == 0) {
            if (*in_RDI <= in_RDI[1] + 0x10) {
              return false;
            }
            in_RDI[1] = in_RDI[1] + 0x10;
            in_RDI[2] = *(ulong *)in_RDI[1];
            in_RDI[3] = *(ulong *)(in_RDI[1] + 8);
          }
          else {
            if (local_20 < in_stack_ffffffffffffffa8) {
              in_stack_ffffffffffffffa8 = local_20;
            }
            GetIOVecPointer(iov,(size_t)op);
            anon_unknown_3::IncrementalCopy
                      ((char *)iov,op,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
            in_RDI[2] = in_stack_ffffffffffffffa8 + in_RDI[2];
            in_RDI[3] = in_RDI[3] - in_stack_ffffffffffffffa8;
            op = op + in_stack_ffffffffffffffa8;
            in_RDI[4] = in_stack_ffffffffffffffa8 + in_RDI[4];
            local_20 = local_20 - in_stack_ffffffffffffffa8;
          }
        }
        else {
          in_stack_ffffffffffffffb0 = (char *)(iov->iov_len - (long)op);
          puVar2 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffb0,&local_20);
          in_stack_ffffffffffffffb8 = (SnappyIOVecWriter *)*puVar2;
          GetIOVecPointer(iov,(size_t)op);
          AppendNoCheck(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
          local_20 = local_20 - (long)in_stack_ffffffffffffffb8;
          if (local_20 != 0) {
            iov = iov + 1;
            op = (char *)0x0;
          }
        }
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool AppendFromSelf(size_t offset, size_t len, char**) {
    // See SnappyArrayWriter::AppendFromSelf for an explanation of
    // the "offset - 1u" trick.
    if (offset - 1u >= total_written_) {
      return false;
    }
    const size_t space_left = output_limit_ - total_written_;
    if (len > space_left) {
      return false;
    }

    // Locate the iovec from which we need to start the copy.
    const iovec* from_iov = curr_iov_;
    size_t from_iov_offset = curr_iov_->iov_len - curr_iov_remaining_;
    while (offset > 0) {
      if (from_iov_offset >= offset) {
        from_iov_offset -= offset;
        break;
      }

      offset -= from_iov_offset;
      --from_iov;
#if !defined(NDEBUG)
      assert(from_iov >= output_iov_);
#endif  // !defined(NDEBUG)
      from_iov_offset = from_iov->iov_len;
    }

    // Copy <len> bytes starting from the iovec pointed to by from_iov_index to
    // the current iovec.
    while (len > 0) {
      assert(from_iov <= curr_iov_);
      if (from_iov != curr_iov_) {
        const size_t to_copy =
            std::min(from_iov->iov_len - from_iov_offset, len);
        AppendNoCheck(GetIOVecPointer(from_iov, from_iov_offset), to_copy);
        len -= to_copy;
        if (len > 0) {
          ++from_iov;
          from_iov_offset = 0;
        }
      } else {
        size_t to_copy = curr_iov_remaining_;
        if (to_copy == 0) {
          // This iovec is full. Go to the next one.
          if (curr_iov_ + 1 >= output_iov_end_) {
            return false;
          }
          ++curr_iov_;
          curr_iov_output_ = reinterpret_cast<char*>(curr_iov_->iov_base);
          curr_iov_remaining_ = curr_iov_->iov_len;
          continue;
        }
        if (to_copy > len) {
          to_copy = len;
        }
        assert(to_copy > 0);

        IncrementalCopy(GetIOVecPointer(from_iov, from_iov_offset),
                        curr_iov_output_, curr_iov_output_ + to_copy,
                        curr_iov_output_ + curr_iov_remaining_);
        curr_iov_output_ += to_copy;
        curr_iov_remaining_ -= to_copy;
        from_iov_offset += to_copy;
        total_written_ += to_copy;
        len -= to_copy;
      }
    }

    return true;
  }